

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-ls.c
# Opt level: O2

int listbigblock(BigFile *bf,char *blockname)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  undefined1 auStack_68 [8];
  BigBlock bb;
  
  bb.Nfile = 0;
  bb._60_4_ = 0;
  bb.attrset = (BigAttrSet *)0x0;
  bb.foffset = (size_t *)0x0;
  bb.fchecksum = (uint *)0x0;
  bb.size = 0;
  bb.fsize = (size_t *)0x0;
  bb.nmemb = 0;
  bb._12_4_ = 0;
  bb.basename = (char *)0x0;
  auStack_68[0] = '\0';
  auStack_68[1] = '\0';
  auStack_68[2] = '\0';
  auStack_68[3] = '\0';
  auStack_68[4] = '\0';
  auStack_68[5] = '\0';
  auStack_68[6] = '\0';
  auStack_68[7] = '\0';
  bb.dtype[0] = '\0';
  bb.dtype[1] = '\0';
  bb.dtype[2] = '\0';
  bb.dtype[3] = '\0';
  bb.dtype[4] = '\0';
  bb.dtype[5] = '\0';
  bb.dtype[6] = '\0';
  bb.dtype[7] = '\0';
  iVar1 = big_file_open_block(bf,(BigBlock *)auStack_68,blockname);
  if (iVar1 == 0) {
    if (longfmt == 0) {
      fprintf(_stdout,"%s\n",blockname);
    }
    else {
      uVar2 = 0;
      uVar3 = 0;
      if (0 < (int)bb.fchecksum) {
        uVar3 = (ulong)bb.fchecksum & 0xffffffff;
      }
      uVar4 = 0;
      for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
        uVar4 = uVar4 + *(int *)((long)bb.foffset + uVar2 * 4);
      }
      uVar4 = (uVar4 >> 0x10) + (uVar4 & 0xffff);
      fprintf(_stdout,"%-28s %s %d %12td %05u %d %s\n",blockname,auStack_68,
              (ulong)bb.dtype & 0xffffffff,bb.basename,(ulong)((uVar4 >> 0x10) + (uVar4 & 0xffff)),
              (ulong)bb.fchecksum & 0xffffffff,bb._8_8_);
    }
    big_block_close((BigBlock *)auStack_68);
    iVar1 = 0;
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

static int listbigblock(BigFile * bf, char * blockname) {
    BigBlock bb = {0};
    if(0 != big_file_open_block(bf, &bb, blockname)) {
        return -1;
    }
    if(!longfmt) {
        fprintf(stdout, "%s\n", blockname);
    } else {
        int i;
        unsigned int sum = 0;
        /* build the sysv sum from sum of each physical file */
        for(i = 0; i < bb.Nfile; i ++) {
            sum += bb.fchecksum[i];
        }
        unsigned int s = sum;
        unsigned int r = (s & 0xffff) + ((s & 0xffffffff) >> 16);
        unsigned int checksum = (r & 0xffff) + (r >> 16);
        fprintf(stdout, "%-28s %s %d %12td %05u %d %s\n", 
                blockname, 
                bb.dtype, bb.nmemb, bb.size, checksum, bb.Nfile,
                bb.basename
                );
    }
    big_block_close(&bb);
    return 0;
}